

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_texture_thumbnail.cxx
# Opt level: O0

void __thiscall xray_re::xr_texture_thumbnail::xr_texture_thumbnail(xr_texture_thumbnail *this)

{
  xr_texture_thumbnail *this_local;
  
  this->_vptr_xr_texture_thumbnail = (_func_int **)&PTR__xr_texture_thumbnail_0038e2d0;
  this->data = (uint8_t *)0x0;
  std::__cxx11::string::string((string *)&this->detail_name);
  std::__cxx11::string::string((string *)&this->bump_name);
  std::__cxx11::string::string((string *)&this->ext_normal_map_name);
  return;
}

Assistant:

xr_texture_thumbnail::xr_texture_thumbnail():
	data(0) {}